

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# yolov7_pnnx.cpp
# Opt level: O2

void qsort_descent_inplace(vector<Object,_std::allocator<Object>_> *faceobjects,int left,int right)

{
  float fVar1;
  pointer pOVar2;
  pointer pOVar3;
  Object *pOVar4;
  long lVar5;
  int right_00;
  int iVar6;
  Object *__b;
  pointer __a;
  long lVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  
  do {
    fVar1 = (faceobjects->super__Vector_base<Object,_std::allocator<Object>_>)._M_impl.
            super__Vector_impl_data._M_start[(left + right) / 2].prob;
    right_00 = right;
    iVar6 = left;
    while (iVar6 <= right_00) {
      pOVar2 = (faceobjects->super__Vector_base<Object,_std::allocator<Object>_>)._M_impl.
               super__Vector_impl_data._M_start;
      lVar5 = (long)iVar6 + -1;
      __a = pOVar2 + (long)iVar6 + -1;
      do {
        iVar9 = iVar6;
        pOVar3 = __a + 1;
        lVar5 = lVar5 + 1;
        iVar10 = iVar9 + 1;
        __a = __a + 1;
        iVar6 = iVar10;
      } while (fVar1 < pOVar3->prob);
      lVar7 = (long)right_00 + 1;
      __b = pOVar2 + (long)right_00 + 1;
      do {
        iVar6 = right_00;
        lVar7 = lVar7 + -1;
        iVar8 = iVar6 + -1;
        pOVar4 = __b + -1;
        __b = __b + -1;
        right_00 = iVar8;
      } while (pOVar4->prob <= fVar1 && fVar1 != pOVar4->prob);
      right_00 = iVar6;
      iVar6 = iVar9;
      if (lVar5 <= lVar7) {
        std::swap<Object>(__a,__b);
        right_00 = iVar8;
        iVar6 = iVar10;
      }
    }
    if (left < right_00) {
      qsort_descent_inplace(faceobjects,left,right_00);
    }
    left = iVar6;
  } while (iVar6 < right);
  return;
}

Assistant:

static void qsort_descent_inplace(std::vector<Object>& faceobjects, int left, int right)
{
    int i = left;
    int j = right;
    float p = faceobjects[(left + right) / 2].prob;

    while (i <= j)
    {
        while (faceobjects[i].prob > p)
            i++;

        while (faceobjects[j].prob < p)
            j--;

        if (i <= j)
        {
            // swap
            std::swap(faceobjects[i], faceobjects[j]);

            i++;
            j--;
        }
    }

    #pragma omp parallel sections
    {
        #pragma omp section
        {
            if (left < j) qsort_descent_inplace(faceobjects, left, j);
        }
        #pragma omp section
        {
            if (i < right) qsort_descent_inplace(faceobjects, i, right);
        }
    }
}